

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O0

Mat * __thiscall ncnn::ModelBin::load(ModelBin *this,int w,int h,int type)

{
  bool bVar1;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  Mat *in_RDI;
  undefined4 in_R8D;
  Mat m;
  Mat *this_00;
  undefined1 local_58 [16];
  Allocator *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  Mat *in_stack_ffffffffffffffc8;
  
  this_00 = in_RDI;
  (**(code **)*in_RSI)(local_58,in_RSI,in_EDX * in_ECX,in_R8D);
  bVar1 = Mat::empty(this_00);
  if (bVar1) {
    Mat::Mat(in_RDI,(Mat *)local_58);
  }
  else {
    Mat::reshape(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                 in_stack_ffffffffffffffb8);
  }
  Mat::~Mat((Mat *)0x15b0b0);
  return this_00;
}

Assistant:

Mat ModelBin::load(int w, int h, int type) const
{
    Mat m = load(w * h, type);
    if (m.empty())
        return m;

    return m.reshape(w, h);
}